

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containersNative.cpp
# Opt level: O2

void chatra::emb::containers::byteArray_remove(Ct *ct)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  ByteArrayData *this;
  
  iVar1 = (*ct->_vptr_NativeCallContext[5])();
  this = (ByteArrayData *)CONCAT44(extraout_var,iVar1);
  SpinLock::lock(&(this->super_ByteArray).lock);
  sVar2 = ByteArrayData::fetchIndex(this,ct,0,false);
  (*ct->_vptr_NativeCallContext[0xe])
            (ct,(ulong)(this->super_ByteArray).data.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start[sVar2]);
  this_00 = &(this->super_ByteArray).data;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
            (this_00,(const_iterator)
                     ((this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start + sVar2));
  (this->super_ByteArray).lock.flag.super___atomic_flag_base._M_i = false;
  return;
}

Assistant:

static void byteArray_remove(Ct& ct) {
	auto* self = ct.self<ByteArrayData>();
	std::lock_guard<SpinLock> lock(self->lock);
	auto position = self->fetchIndex(ct, 0, false);
	ct.set(self->data[position]);
	self->data.erase(self->data.cbegin() + position);
}